

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.cpp
# Opt level: O0

Tile * __thiscall TilePool::accessTile(TilePool *this,size_t sectorId,uint offset)

{
  pointer this_00;
  ulong in_RDX;
  vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
  *in_RSI;
  Tile *in_RDI;
  PoolItem *item;
  Tile *args_1;
  unsigned_long *in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  
  args_1 = in_RDI;
  ::fmt::v11::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)&stack0xffffffffffffffc8,
             "TilePool access sector {} with offset {}.",0x29);
  spdlog::debug<unsigned_long&,unsigned_int&>
            ((format_string_t<unsigned_long_&,_unsigned_int_&>)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,(uint *)args_1);
  std::
  vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
  ::operator[](in_RSI,in_RDX >> 6);
  this_00 = std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>::get
                      ((unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)
                       in_RDI);
  Chunk::accessTile(&this_00->chunk,(uint)((ulong)args_1 >> 0x20));
  return args_1;
}

Assistant:

Tile TilePool::accessTile(size_t sectorId, unsigned int offset) {
    /*spdlog::debug("TilePool access id {}.", id);
    PoolItem* item = items_[static_cast<size_t>((id - baseId_) / CHUNK_AREA)].get();
    assert(item->allocated.test(id % CHUNK_AREA));
    return item->chunk.accessTile(id % CHUNK_AREA);*/

    spdlog::debug("TilePool access sector {} with offset {}.", sectorId, offset);
    PoolItem* item = items_[sectorId / SECTORS_PER_CHUNK].get();
    assert(item->allocated.test(sectorId % SECTORS_PER_CHUNK) && offset < SECTOR_SIZE);
    return item->chunk.accessTile(sectorId % SECTORS_PER_CHUNK * SECTOR_SIZE + offset);
}